

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::erase_same_node(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *this,iterator _begin,iterator _end)

{
  bool bVar1;
  byte bVar2;
  template_ElementType<3UL> *ppbVar3;
  int i;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *this_00;
  int iVar4;
  size_type i_00;
  size_type sVar5;
  ulong uVar6;
  size_type to_erase;
  size_type sVar7;
  
  this_00 = _begin.node;
  if (this_00 != _end.node) {
    __assert_fail("_begin.node == _end.node",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xae5,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>]"
                 );
  }
  i = _begin.position;
  iVar4 = _end.position - i;
  if (iVar4 != 0 && i <= _end.position) {
    to_erase = (size_type)iVar4;
    bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            ::leaf(this_00);
    if (!bVar1) {
      i_00 = (size_type)i;
      sVar7 = to_erase;
      sVar5 = i_00;
      while( true ) {
        sVar5 = sVar5 + 1;
        bVar1 = sVar7 == 0;
        sVar7 = sVar7 - 1;
        if (bVar1) break;
        ppbVar3 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                  ::GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                                   *)this_00);
        internal_clear(this,ppbVar3[sVar5]);
      }
      uVar6 = i_00 + to_erase;
      while( true ) {
        uVar6 = uVar6 + 1;
        i_00 = i_00 + 1;
        bVar2 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                ::count(this_00);
        if (bVar2 < uVar6) break;
        ppbVar3 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                  ::GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                                   *)this_00);
        btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        ::set_child(this_00,i_00,ppbVar3[uVar6]);
        btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
        GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                       *)this_00);
      }
    }
    btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
    remove_values_ignore_children(this_00,i,to_erase,(allocator_type *)this);
    return;
  }
  __assert_fail("_end.position > _begin.position",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xae6,
                "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>]"
               );
}

Assistant:

void btree<P>::erase_same_node(iterator _begin, iterator _end) {
        assert(_begin.node == _end.node);
        assert(_end.position > _begin.position);

        node_type *node = _begin.node;
        size_type to_erase = _end.position - _begin.position;
        if (!node->leaf()) {
            // Delete all children between _begin and _end.
            for (size_type i = 0; i < to_erase; ++i) {
                internal_clear(node->child(_begin.position + i + 1));
            }
            // Rotate children after _end into new positions.
            for (size_type i = _begin.position + to_erase + 1; i <= node->count(); ++i) {
                node->set_child(i - to_erase, node->child(i));
                node->clear_child(i);
            }
        }
        node->remove_values_ignore_children(_begin.position, to_erase,
                                            mutable_allocator());

        // Do not need to update rightmost_, because
        // * either _end == this->end(), and therefore node == rightmost_, and still
        //   exists
        // * or _end != this->end(), and therefore rightmost_ hasn't been erased, since
        //   it wasn't covered in [_begin, _end)
    }